

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O2

uint8_t * ptls_encode_quicint(uint8_t *p,uint64_t v)

{
  sbyte sVar1;
  int iVar2;
  byte bVar3;
  
  if (0x3f < v) {
    if (v < 0x4000) {
      *p = (byte)(v >> 8) | 0x40;
      p = p + 1;
    }
    else {
      if (v < 0x40000000) {
        iVar2 = 0x10;
        bVar3 = 0x80;
        sVar1 = 0x18;
      }
      else {
        if (v >> 0x3e != 0) {
          __assert_fail("v <= 4611686018427387903",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/include/picotls.h"
                        ,0x5ab,"uint8_t *ptls_encode_quicint(uint8_t *, uint64_t)");
        }
        iVar2 = 0x30;
        bVar3 = 0xc0;
        sVar1 = 0x38;
      }
      *p = (byte)(v >> sVar1) | bVar3;
      p = p + 1;
      do {
        *p = (uint8_t)(v >> ((byte)iVar2 & 0x3f));
        p = p + 1;
        iVar2 = iVar2 + -8;
      } while (iVar2 != 0);
    }
  }
  *p = (uint8_t)v;
  return p + 1;
}

Assistant:

inline uint8_t *ptls_encode_quicint(uint8_t *p, uint64_t v)
{
    if (PTLS_UNLIKELY(v > 63)) {
        if (PTLS_UNLIKELY(v > 16383)) {
            unsigned sb;
            if (PTLS_UNLIKELY(v > 1073741823)) {
                assert(v <= 4611686018427387903);
                *p++ = 0xc0 | (uint8_t)(v >> 56);
                sb = 6 * 8;
            } else {
                *p++ = 0x80 | (uint8_t)(v >> 24);
                sb = 2 * 8;
            }
            do {
                *p++ = (uint8_t)(v >> sb);
            } while ((sb -= 8) != 0);
        } else {
            *p++ = 0x40 | (uint8_t)((uint16_t)v >> 8);
        }
    }
    *p++ = (uint8_t)v;
    return p;
}